

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DShadowProjGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float *pfVar6;
  float lod;
  float fVar7;
  TexLookupParams *param_1_local;
  ShaderEvalContext *c_local;
  
  pfVar6 = tcu::Vector<float,_4>::z(c->in);
  fVar7 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::w(c->in);
  fVar1 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::x(c->in);
  fVar2 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::w(c->in);
  fVar3 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::y(c->in);
  fVar4 = *pfVar6;
  pfVar6 = tcu::Vector<float,_4>::w(c->in);
  fVar5 = *pfVar6;
  lod = computeLodFromGrad2D(c);
  fVar7 = texture2DShadow(c,fVar7 / fVar1,fVar2 / fVar3,fVar4 / fVar5,lod);
  pfVar6 = tcu::Vector<float,_4>::x(&c->color);
  *pfVar6 = fVar7;
  return;
}

Assistant:

static void		evalTexture2DShadowProjGrad			(gls::ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), computeLodFromGrad2D(c)); }